

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpproxy.cpp
# Opt level: O0

void __thiscall tcpproxy::tcpproxy(tcpproxy *this,naiveconfig *cfg1)

{
  naiveconfig *cfg1_local;
  tcpproxy *this_local;
  
  proxy::proxy(&this->super_proxy);
  (this->super_proxy)._vptr_proxy = (_func_int **)&PTR__tcpproxy_00118d70;
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map(&this->sfh);
  this->events = (epoll_event *)0x0;
  (this->super_proxy).cfg = cfg1;
  return;
}

Assistant:

tcpproxy::tcpproxy(naiveconfig *cfg1)
{
    events = NULL;
    cfg = cfg1;
}